

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall
xatlas::internal::
HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
::add(HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
      *this,Vector2 *key)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t i;
  long lVar4;
  
  if (this->m_slots == (uint32_t *)0x0) {
    alloc(this);
  }
  uVar3 = 0x1505;
  lVar4 = 0;
  do {
    pbVar1 = (byte *)((long)&key->x + lVar4);
    lVar4 = lVar4 + 1;
    uVar3 = (uint)*pbVar1 + uVar3 * 0x1003f;
  } while (lVar4 != 8);
  uVar2 = (ulong)uVar3 % (ulong)this->m_numSlots;
  ArrayBase::push_back(&(this->m_keys).m_base,(uint8_t *)key);
  ArrayBase::push_back(&(this->m_next).m_base,(uint8_t *)(this->m_slots + uVar2));
  this->m_slots[uVar2] = (this->m_next).m_base.size - 1;
  return;
}

Assistant:

void add(const Key &key)
	{
		if (!m_slots)
			alloc();
		const uint32_t hash = computeHash(key);
		m_keys.push_back(key);
		m_next.push_back(m_slots[hash]);
		m_slots[hash] = m_next.size() - 1;
	}